

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_slice * cram_read_slice(cram_fd *fd)

{
  int iVar1;
  FILE *__stream;
  cram_block *b_00;
  cram_slice *s_00;
  cram_block_slice_hdr *pcVar2;
  char *pcVar3;
  cram_block **ppcVar4;
  cram_block *pcVar5;
  int local_38;
  int local_34;
  int min_id;
  int max_id;
  int n;
  int i;
  cram_slice *s;
  cram_block *b;
  cram_fd *fd_local;
  
  b_00 = cram_read_block(fd);
  s_00 = (cram_slice *)calloc(1,0x100);
  if ((b_00 != (cram_block *)0x0) && (s_00 != (cram_slice *)0x0)) {
    s_00->hdr_block = b_00;
    __stream = _stderr;
    if (b_00->content_type == MAPPED_SLICE || b_00->content_type == UNMAPPED_SLICE) {
      pcVar2 = cram_decode_slice_header(fd,b_00);
      s_00->hdr = pcVar2;
      if (pcVar2 != (cram_block_slice_hdr *)0x0) {
        iVar1 = s_00->hdr->num_blocks;
        ppcVar4 = (cram_block **)calloc((long)iVar1,8);
        s_00->block = ppcVar4;
        if (s_00->block != (cram_block **)0x0) {
          local_34 = 0;
          local_38 = 0x7fffffff;
          for (max_id = 0; max_id < iVar1; max_id = max_id + 1) {
            pcVar5 = cram_read_block(fd);
            s_00->block[max_id] = pcVar5;
            if (pcVar5 == (cram_block *)0x0) goto LAB_0014898b;
            if (s_00->block[max_id]->content_type == EXTERNAL) {
              if (local_34 < s_00->block[max_id]->content_id) {
                local_34 = s_00->block[max_id]->content_id;
              }
              if (s_00->block[max_id]->content_id < local_38) {
                local_38 = s_00->block[max_id]->content_id;
              }
            }
          }
          if ((-1 < local_38) && (local_34 < 0x400)) {
            ppcVar4 = (cram_block **)calloc(0x400,8);
            s_00->block_by_id = ppcVar4;
            if (ppcVar4 == (cram_block **)0x0) goto LAB_0014898b;
            for (max_id = 0; max_id < iVar1; max_id = max_id + 1) {
              if (s_00->block[max_id]->content_type == EXTERNAL) {
                s_00->block_by_id[s_00->block[max_id]->content_id] = s_00->block[max_id];
              }
            }
          }
          s_00->cigar = (uint32_t *)0x0;
          s_00->cigar_alloc = 0;
          s_00->ncigar = 0;
          pcVar5 = cram_new_block(EXTERNAL,0);
          s_00->seqs_blk = pcVar5;
          if (pcVar5 != (cram_block *)0x0) {
            pcVar5 = cram_new_block(EXTERNAL,0xc);
            s_00->qual_blk = pcVar5;
            if (pcVar5 != (cram_block *)0x0) {
              pcVar5 = cram_new_block(EXTERNAL,0xb);
              s_00->name_blk = pcVar5;
              if (pcVar5 != (cram_block *)0x0) {
                pcVar5 = cram_new_block(EXTERNAL,1);
                s_00->aux_blk = pcVar5;
                if (pcVar5 != (cram_block *)0x0) {
                  pcVar5 = cram_new_block(EXTERNAL,0xd);
                  s_00->base_blk = pcVar5;
                  if (pcVar5 != (cram_block *)0x0) {
                    pcVar5 = cram_new_block(EXTERNAL,0xe);
                    s_00->soft_blk = pcVar5;
                    if (pcVar5 != (cram_block *)0x0) {
                      s_00->crecs = (cram_record *)0x0;
                      s_00->last_apos = s_00->hdr->ref_seq_start;
                      return s_00;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      pcVar3 = cram_content_type2str(b_00->content_type);
      fprintf(__stream,"Unexpected block of type %s\n",pcVar3);
    }
  }
LAB_0014898b:
  if (b_00 != (cram_block *)0x0) {
    cram_free_block(b_00);
  }
  if (s_00 != (cram_slice *)0x0) {
    s_00->hdr_block = (cram_block *)0x0;
    cram_free_slice(s_00);
  }
  return (cram_slice *)0x0;
}

Assistant:

cram_slice *cram_read_slice(cram_fd *fd) {
    cram_block *b = cram_read_block(fd);
    cram_slice *s = calloc(1, sizeof(*s));
    int i, n, max_id, min_id;

    if (!b || !s)
	goto err;

    s->hdr_block = b;
    switch (b->content_type) {
    case MAPPED_SLICE:
    case UNMAPPED_SLICE:
	if (!(s->hdr = cram_decode_slice_header(fd, b)))
	    goto err;
	break;

    default:
	fprintf(stderr, "Unexpected block of type %s\n",
		cram_content_type2str(b->content_type));
	goto err;
    }

    s->block = calloc(n = s->hdr->num_blocks, sizeof(*s->block));
    if (!s->block)
	goto err;

    for (max_id = i = 0, min_id = INT_MAX; i < n; i++) {
	if (!(s->block[i] = cram_read_block(fd)))
	    goto err;

	if (s->block[i]->content_type == EXTERNAL) {
	    if (max_id < s->block[i]->content_id)
		max_id = s->block[i]->content_id;
	    if (min_id > s->block[i]->content_id)
		min_id = s->block[i]->content_id;
	}
    }
    if (min_id >= 0 && max_id < 1024) {
	if (!(s->block_by_id = calloc(1024, sizeof(s->block[0]))))
	    goto err;

	for (i = 0; i < n; i++) {
	    if (s->block[i]->content_type != EXTERNAL)
		continue;
	    s->block_by_id[s->block[i]->content_id] = s->block[i];
	}
    }

    /* Initialise encoding/decoding tables */
    s->cigar = NULL;
    s->cigar_alloc = 0;
    s->ncigar = 0;

    if (!(s->seqs_blk = cram_new_block(EXTERNAL, 0)))      goto err;
    if (!(s->qual_blk = cram_new_block(EXTERNAL, DS_QS)))  goto err;
    if (!(s->name_blk = cram_new_block(EXTERNAL, DS_RN)))  goto err;
    if (!(s->aux_blk  = cram_new_block(EXTERNAL, DS_aux))) goto err;
    if (!(s->base_blk = cram_new_block(EXTERNAL, DS_IN)))  goto err;
    if (!(s->soft_blk = cram_new_block(EXTERNAL, DS_SC)))  goto err;

    s->crecs = NULL;

    s->last_apos = s->hdr->ref_seq_start;
    
    return s;

 err:
    if (b)
	cram_free_block(b);
    if (s) {
	s->hdr_block = NULL;
	cram_free_slice(s);
    }
    return NULL;
}